

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall Js::BufferReader::Read<unsigned_int>(BufferReader *this,uint *data)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *data_local;
  BufferReader *this_local;
  
  if (this->lengthLeft < 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3bc,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local._7_1_ = false;
  }
  else {
    *data = *(uint *)this->current;
    this->current = this->current + 4;
    this->lengthLeft = this->lengthLeft - 4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Read(T * data)
        {
            if (lengthLeft < sizeof(T))
            {
                AssertOrFailFast(false);
                return false;
            }
            *data = *(T *)current;
            current += sizeof(T);
            lengthLeft -= sizeof(T);
            return true;
        }